

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall
VertexClustering::initClusters
          (VertexClustering *this,vector<VCEdge,_std::allocator<VCEdge>_> *edges)

{
  _Rb_tree_header *__last;
  _Base_ptr p_Var1;
  pointer ppVVar2;
  VCFace *f;
  VCCluster *this_00;
  int iVar3;
  _Base_ptr p_Var4;
  int iVar5;
  ulong uVar6;
  _Rb_tree_header *p_Var7;
  vector<VCFace_*,_std::allocator<VCFace_*>_> faces_vec;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> faces;
  allocator_type local_79;
  VCFace *local_78 [3];
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  local_60;
  
  __last = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar5 = (int)((ulong)((long)(edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 4);
  if ((ulong)(long)iVar5 < (this->opts).numCluster) {
    (this->opts).numCluster = (long)iVar5;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  if ((this->opts).numCluster != 0) {
    do {
      iVar3 = rand();
      local_78[0] = (edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar3 % iVar5].f1;
      p_Var4 = &__last->_M_header;
      for (p_Var1 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0;
          p_Var1 = (&p_Var1->_M_left)[*(VCFace **)(p_Var1 + 1) < local_78[0]]) {
        if (*(VCFace **)(p_Var1 + 1) >= local_78[0]) {
          p_Var4 = p_Var1;
        }
      }
      p_Var7 = __last;
      if (((_Rb_tree_header *)p_Var4 != __last) &&
         (p_Var7 = (_Rb_tree_header *)p_Var4,
         local_78[0] < (VCFace *)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
        p_Var7 = __last;
      }
    } while (((p_Var7 != __last) ||
             (std::
              _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
              ::_M_insert_unique<VCFace*const&>
                        ((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                          *)&local_60,local_78), p_Var7 != __last)) ||
            (local_60._M_impl.super__Rb_tree_header._M_node_count < (this->opts).numCluster));
  }
  std::vector<VCFace*,std::allocator<VCFace*>>::vector<std::_Rb_tree_const_iterator<VCFace*>,void>
            ((vector<VCFace*,std::allocator<VCFace*>> *)local_78,
             (_Rb_tree_const_iterator<VCFace_*>)
             local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<VCFace_*>)__last,&local_79);
  for (uVar6 = 0; uVar6 < (this->opts).numCluster; uVar6 = uVar6 + 1) {
    ppVVar2 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    f = (VCFace *)
        (local_78[0]->normal).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[uVar6 - 2];
    this_00 = ppVVar2[uVar6 + 1];
    VCCluster::delItem(*ppVVar2,f);
    VCCluster::addItem(this_00,f);
  }
  if (local_78[0] != (VCFace *)0x0) {
    operator_delete(local_78[0]);
  }
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void VertexClustering::initClusters(vector<VCEdge>& edges) {
	int n = edges.size();
	set<VCFace*> faces;
	if (opts.numCluster > n)
		opts.numCluster = n;
	while (faces.size() < opts.numCluster) {
		while (true) {
			int r = rand() % n;
			VCFace* f = edges[r].f1;
			if (faces.find(f) == faces.end()) {
				faces.insert(f);
				break;
			}
		}
	}
	vector<VCFace*> faces_vec(faces.begin(), faces.end());
	for (int i = 0; i < opts.numCluster; ++i) {
		clusters[0]->giveItem(faces_vec[i], clusters[i + 1]);
	}
	
}